

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O2

void __thiscall
Finger::getPoints(Finger *this,vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *cnt,
                 Vec4i *v)

{
  pointer pPVar1;
  int iVar2;
  
  pPVar1 = (cnt->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = pPVar1[(v->super_Matx<int,_4,_1>).val[0]].y;
  (this->ptStart).x = pPVar1[(v->super_Matx<int,_4,_1>).val[0]].x;
  (this->ptStart).y = iVar2;
  iVar2 = pPVar1[(v->super_Matx<int,_4,_1>).val[1]].y;
  (this->ptEnd).x = pPVar1[(v->super_Matx<int,_4,_1>).val[1]].x;
  (this->ptEnd).y = iVar2;
  iVar2 = pPVar1[(v->super_Matx<int,_4,_1>).val[2]].y;
  (this->ptFar).x = pPVar1[(v->super_Matx<int,_4,_1>).val[2]].x;
  (this->ptFar).y = iVar2;
  return;
}

Assistant:

void Finger::getPoints(vector<Point> cnt, Vec4i v) {
    int startidx = v[0];
    ptStart = Point(cnt[startidx]);
    int endidx = v[1];
    ptEnd = Point(cnt[endidx]);
    int faridx = v[2];
    ptFar = Point(cnt[faridx]);
}